

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePrimitiveIdAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
  *this_00;
  reference pEVar4;
  mapped_type *pmVar5;
  BuiltInsValidator *local_1048;
  code *local_1040;
  undefined8 local_1038;
  type local_1030;
  value_type local_ee0;
  uint32_t local_ebc;
  string local_eb8;
  string local_e98;
  DiagnosticStream local_e78;
  ExecutionModel local_c9c;
  iterator iStack_c98;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  BuiltInsValidator *local_c78;
  code *local_c70;
  undefined8 local_c68;
  type local_c60;
  value_type local_af8;
  uint32_t local_ad4;
  ExecutionModel local_ad0 [2];
  BuiltInsValidator *local_ac8;
  code *local_ac0;
  undefined8 local_ab8;
  type local_ab0;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_948;
  uint32_t local_924;
  ExecutionModel local_920 [2];
  BuiltInsValidator *local_918;
  code *local_910;
  undefined8 local_908;
  type local_900;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_798;
  uint32_t local_774;
  ExecutionModel local_770 [2];
  BuiltInsValidator *local_768;
  code *local_760;
  undefined8 local_758;
  type local_750;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_5e8;
  uint32_t local_5c4;
  ExecutionModel local_5c0 [2];
  BuiltInsValidator *local_5b8;
  code *local_5b0;
  undefined8 local_5a8;
  type local_5a0;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_438;
  uint32_t local_414;
  ExecutionModel local_410 [2];
  BuiltInsValidator *local_408;
  code *local_400;
  undefined8 local_3f8;
  type local_3f0;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_288;
  uint32_t local_264;
  string local_260;
  string local_240;
  DiagnosticStream local_220;
  StorageClass local_44;
  Instruction *pIStack_40;
  StorageClass storage_class;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_40 = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    local_44 = GetStorageClass(pIStack_40);
    if (((local_44 != Max) && (local_44 != Input)) && (local_44 != Output)) {
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_220,
                          (char (*) [106])
                          "Vulkan spec allows BuiltIn PrimitiveId to be only used for variables with Input or Output storage class. "
                         );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_240,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,pIStack_40,ExecutionModelMax);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_240);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x57fa85);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_260,this,pIStack_40);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_260);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    if (local_44 == Output) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x885,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidatePrimitiveIdAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      this_00 = &this->id_to_at_reference_checks_;
      local_264 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_264);
      local_400 = ValidateNotCalledWithExecutionModel;
      local_3f8 = 0;
      local_410[1] = 0x10ee;
      local_410[0] = ExecutionModelTessellationControl;
      local_408 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[140],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_3f0,(offset_in_BuiltInsValidator_to_subr *)&local_400,&local_408,
                 (int *)(local_410 + 1),
                 (char (*) [140])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is TessellationControl."
                 ,local_410,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_288,&local_3f0)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_288);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_288);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_3f0);
      local_414 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_414);
      local_5b0 = ValidateNotCalledWithExecutionModel;
      local_5a8 = 0;
      local_5c0[1] = 0x10ee;
      local_5c0[0] = ExecutionModelTessellationEvaluation;
      local_5b8 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[143],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_5a0,(offset_in_BuiltInsValidator_to_subr *)&local_5b0,&local_5b8,
                 (int *)(local_5c0 + 1),
                 (char (*) [143])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is TessellationEvaluation."
                 ,local_5c0,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_438,&local_5a0)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_438);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_438);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_5a0);
      local_5c4 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_5c4);
      local_760 = ValidateNotCalledWithExecutionModel;
      local_758 = 0;
      local_770[1] = 0x10ee;
      local_770[0] = ExecutionModelFragment;
      local_768 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[129],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_750,(offset_in_BuiltInsValidator_to_subr *)&local_760,&local_768,
                 (int *)(local_770 + 1),
                 (char (*) [129])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is Fragment."
                 ,local_770,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_5e8,&local_750)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_5e8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_5e8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_750);
      local_774 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_774);
      local_910 = ValidateNotCalledWithExecutionModel;
      local_908 = 0;
      local_920[1] = 0x10ee;
      local_920[0] = ExecutionModelIntersectionKHR;
      local_918 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[136],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_900,(offset_in_BuiltInsValidator_to_subr *)&local_910,&local_918,
                 (int *)(local_920 + 1),
                 (char (*) [136])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is IntersectionKHR."
                 ,local_920,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_798,&local_900)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_798);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_798);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_900);
      local_924 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_924);
      local_ac0 = ValidateNotCalledWithExecutionModel;
      local_ab8 = 0;
      local_ad0[1] = 0x10ee;
      local_ad0[0] = AnyHitKHR;
      local_ac8 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[130],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_ab0,(offset_in_BuiltInsValidator_to_subr *)&local_ac0,&local_ac8,
                 (int *)(local_ad0 + 1),
                 (char (*) [130])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is AnyHitKHR."
                 ,local_ad0,(Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_948,&local_ab0)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_948);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_948);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_ab0);
      local_ad4 = Instruction::id(pIStack_40);
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
               ::operator[](this_00,&local_ad4);
      local_c70 = ValidateNotCalledWithExecutionModel;
      local_c68 = 0;
      __range3._4_4_ = 0x10ee;
      __range3._0_4_ = 0x14c4;
      local_c78 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const(&)[134],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_c60,(offset_in_BuiltInsValidator_to_subr *)&local_c70,&local_c78,
                 (int *)((long)&__range3 + 4),
                 (char (*) [134])
                 "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is ClosestHitKHR."
                 ,(ExecutionModel *)&__range3,(Decoration *)built_in_inst_local,
                 referenced_inst_local,pIStack_40,(_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_af8,&local_c60)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar5,&local_af8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_af8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_c60);
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    iStack_c98 = std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,&stack0xfffffffffffff368), bVar1) {
      pEVar4 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_c9c = *pEVar4;
      if (((3 < local_c9c - ExecutionModelTessellationControl) &&
          (local_c9c != ExecutionModelMeshNV)) &&
         ((2 < local_c9c - ExecutionModelIntersectionKHR && (local_c9c != ExecutionModelMeshEXT))))
      {
        ValidationState_t::diag(&local_e78,this->_,SPV_ERROR_INVALID_DATA,pIStack_40);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_e98,this->_,0x10ea,(char *)0x0);
        pDVar3 = DiagnosticStream::operator<<(&local_e78,&local_e98);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [207])
                                   "Vulkan spec allows BuiltIn PrimitiveId to be used only with Fragment, TessellationControl, TessellationEvaluation, Geometry, MeshNV, MeshEXT, IntersectionKHR, AnyHitKHR, and ClosestHitKHR execution models. "
                           );
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_eb8,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,pIStack_40,local_c9c);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_eb8);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_eb8);
        std::__cxx11::string::~string((string *)&local_e98);
        DiagnosticStream::~DiagnosticStream(&local_e78);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_ebc = Instruction::id(pIStack_40);
    pmVar5 = std::
             map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
             ::operator[](&this->id_to_at_reference_checks_,&local_ebc);
    local_1040 = ValidatePrimitiveIdAtReference;
    local_1038 = 0;
    local_1048 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_1030,(offset_in_BuiltInsValidator_to_subr *)&local_1040,&local_1048,
               (Decoration *)built_in_inst_local,referenced_inst_local,pIStack_40,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_ee0,&local_1030);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(pmVar5,&local_ee0);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_ee0);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_1030);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePrimitiveIdAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << "Vulkan spec allows BuiltIn PrimitiveId to be only used for "
                "variables with Input or Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Output) {
      assert(function_id_ == 0);
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "TessellationControl.",
          spv::ExecutionModel::TessellationControl, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "TessellationEvaluation.",
          spv::ExecutionModel::TessellationEvaluation, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "Fragment.",
          spv::ExecutionModel::Fragment, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "IntersectionKHR.",
          spv::ExecutionModel::IntersectionKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "AnyHitKHR.",
          spv::ExecutionModel::AnyHitKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "ClosestHitKHR.",
          spv::ExecutionModel::ClosestHitKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::Fragment:
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation:
        case spv::ExecutionModel::Geometry:
        case spv::ExecutionModel::MeshNV:
        case spv::ExecutionModel::MeshEXT:
        case spv::ExecutionModel::IntersectionKHR:
        case spv::ExecutionModel::AnyHitKHR:
        case spv::ExecutionModel::ClosestHitKHR: {
          // Ok.
          break;
        }

        default: {
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(4330)
                 << "Vulkan spec allows BuiltIn PrimitiveId to be used only "
                    "with Fragment, TessellationControl, "
                    "TessellationEvaluation, Geometry, MeshNV, MeshEXT, "
                    "IntersectionKHR, AnyHitKHR, and ClosestHitKHR execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidatePrimitiveIdAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}